

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O3

void google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
               (int field_number,MessageLite *value,CodedOutputStream *output)

{
  byte *pbVar1;
  uint8 *puVar2;
  bool bVar3;
  ulong uVar4;
  undefined4 extraout_var;
  LogMessage *other;
  int iVar5;
  byte *pbVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  LogFinisher local_61;
  LogMessage local_60;
  
  uVar9 = field_number * 8 + 2;
  uVar4 = (ulong)uVar9;
  if (output->buffer_size_ < 5) {
    io::CodedOutputStream::WriteVarint32SlowPath(output,uVar9);
  }
  else {
    pbVar1 = output->buffer_;
    pbVar6 = pbVar1;
    if (0x7f < (uint)(field_number << 3)) {
      do {
        uVar9 = (uint)uVar4;
        *pbVar6 = (byte)uVar4 | 0x80;
        uVar4 = uVar4 >> 7;
        pbVar6 = pbVar6 + 1;
      } while (0x3fff < uVar9);
    }
    *pbVar6 = (byte)uVar4;
    iVar5 = ((int)pbVar6 - (int)pbVar1) + 1;
    output->buffer_ = output->buffer_ + iVar5;
    output->buffer_size_ = output->buffer_size_ - iVar5;
  }
  uVar9 = (*value->_vptr_MessageLite[0xf])(value);
  if (output->buffer_size_ < 5) {
    io::CodedOutputStream::WriteVarint32SlowPath(output,uVar9);
    iVar5 = output->buffer_size_;
  }
  else {
    pbVar1 = output->buffer_;
    pbVar6 = pbVar1;
    uVar7 = uVar9;
    uVar8 = uVar9;
    if (0x7f < uVar9) {
      do {
        *pbVar6 = (byte)uVar7 | 0x80;
        uVar8 = uVar7 >> 7;
        pbVar6 = pbVar6 + 1;
        bVar3 = 0x3fff < uVar7;
        uVar7 = uVar8;
      } while (bVar3);
    }
    *pbVar6 = (byte)uVar8;
    iVar5 = ((int)pbVar6 - (int)pbVar1) + 1;
    output->buffer_ = output->buffer_ + iVar5;
    iVar5 = output->buffer_size_ - iVar5;
    output->buffer_size_ = iVar5;
  }
  if ((int)uVar9 <= iVar5) {
    puVar2 = output->buffer_;
    output->buffer_ = puVar2 + (int)uVar9;
    output->buffer_size_ = iVar5 - uVar9;
    if (puVar2 != (uint8 *)0x0) {
      uVar4 = io::CodedOutputStream::default_serialization_deterministic_;
      if (output->serialization_deterministic_is_overridden_ != false) {
        uVar4 = (ulong)output->serialization_deterministic_override_;
      }
      iVar5 = (*value->_vptr_MessageLite[0x10])(value,(ulong)(uVar4 != 0),puVar2);
      if (CONCAT44(extraout_var,iVar5) - (long)puVar2 != (long)(int)uVar9) {
        LogMessage::LogMessage
                  (&local_60,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/wire_format_lite.cc"
                   ,0x247);
        other = LogMessage::operator<<(&local_60,"CHECK failed: (end - target) == (size): ");
        LogFinisher::operator=(&local_61,other);
        LogMessage::~LogMessage(&local_60);
      }
      return;
    }
  }
  (*value->_vptr_MessageLite[0xd])(value,output);
  return;
}

Assistant:

void WireFormatLite::WriteMessageMaybeToArray(int field_number,
                                              const MessageLite& value,
                                              io::CodedOutputStream* output) {
  WriteTag(field_number, WIRETYPE_LENGTH_DELIMITED, output);
  const int size = value.GetCachedSize();
  output->WriteVarint32(size);
  uint8* target = output->GetDirectBufferForNBytesAndAdvance(size);
  if (target != NULL) {
    uint8* end = value.InternalSerializeWithCachedSizesToArray(
        output->IsSerializationDeterministic(), target);
    GOOGLE_DCHECK_EQ(end - target, size);
  } else {
    value.SerializeWithCachedSizes(output);
  }
}